

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getpart.c
# Opt level: O1

int getpart(char **outbuf,size_t *outlen,char *main,char *sub,FILE *stream)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  byte *__s;
  size_t sVar6;
  void *pvVar7;
  ushort **ppuVar8;
  long lVar9;
  byte *pbVar10;
  size_t uznum;
  long lVar11;
  byte bVar12;
  size_t sVar13;
  bool bVar14;
  size_t outalloc;
  char ptag [80];
  char csub [80];
  char cmain [80];
  char patt [80];
  char couter [80];
  int local_204;
  int local_1fc;
  size_t local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined8 local_1d0;
  char local_1c8 [80];
  char local_178 [80];
  char local_128 [80];
  char local_d8 [80];
  char local_88 [88];
  
  local_1e8 = 0x100;
  *outlen = 0;
  local_1d0 = (FILE *)stream;
  pcVar5 = (char *)(*Curl_cmalloc)(0x100);
  *outbuf = pcVar5;
  if (pcVar5 == (char *)0x0) {
    return -1;
  }
  __s = (byte *)0x0;
  *pcVar5 = '\0';
  local_d8[0] = '\0';
  local_1c8[0] = '\0';
  local_178[0] = '\0';
  local_128[0] = '\0';
  local_88[0] = '\0';
  bVar1 = true;
  sVar13 = 0;
  local_1fc = 0;
  local_204 = 0;
  local_1e0 = sub;
  local_1d8 = main;
LAB_00103ed3:
  do {
    uznum = sVar13;
    if (__s == (byte *)0x0) {
      __s = (byte *)(*Curl_cmalloc)(0x80);
      uznum = 0x80;
      if (__s != (byte *)0x0) goto LAB_00103efa;
      uVar3 = 0xffffffff;
    }
    else {
LAB_00103efa:
      iVar2 = curlx_uztosi(uznum);
      pcVar5 = fgets((char *)__s,iVar2,local_1d0);
      if (pcVar5 != (char *)0x0) {
        sVar6 = strlen((char *)__s);
        lVar9 = 2;
        if ((__s[sVar6 - 1] != 10) && (lVar9 = 3, uznum - 1 <= sVar6)) {
          pvVar7 = (*Curl_crealloc)(__s,uznum * 2);
          if (pvVar7 == (void *)0x0) {
            lVar9 = 1;
          }
          else {
            lVar9 = 0;
          }
        }
        iVar2 = (*(code *)((long)&DAT_001071a8 + (long)(int)(&DAT_001071a8)[lVar9]))();
        return iVar2;
      }
      uVar3 = 1;
      sVar13 = uznum;
    }
    if (uVar3 != 0) goto LAB_001043c4;
    bVar12 = *__s;
    if (bVar12 != 0) {
      ppuVar8 = __ctype_b_loc();
      lVar11 = 2;
      lVar9 = 0;
      do {
        if ((*(byte *)((long)*ppuVar8 + (ulong)bVar12 * 2 + 1) & 0x20) == 0) {
          if (bVar12 == 0x3c) {
            if (__s[lVar11 + -1] == 0x2f) {
              pbVar10 = __s + (2 - lVar9);
              bVar12 = __s[lVar11];
              if (bVar12 == 0) goto LAB_00104080;
              ppuVar8 = __ctype_b_loc();
              goto LAB_0010405e;
            }
            if (!bVar1) goto LAB_001042c5;
            pbVar10 = __s + (1 - lVar9);
            bVar12 = __s[lVar11 + -1];
            if (bVar12 == 0) goto LAB_001041ba;
            ppuVar8 = __ctype_b_loc();
            goto LAB_00104198;
          }
          break;
        }
        bVar12 = __s[lVar11 + -1];
        lVar9 = lVar9 + -1;
        lVar11 = lVar11 + 1;
      } while (bVar12 != 0);
    }
  } while ((bVar1) ||
          (iVar2 = appenddata(outbuf,outlen,&local_1e8,(char *)__s,local_1fc), iVar2 == 0));
  uVar3 = 0xffffffff;
  goto LAB_001043c4;
  while( true ) {
    bVar12 = pbVar10[1];
    pbVar10 = pbVar10 + 1;
    if (bVar12 == 0) break;
LAB_0010405e:
    if ((bVar12 == 0x3e) || (((*ppuVar8)[bVar12] & 0x2000) != 0)) break;
  }
LAB_00104080:
  if (0x4f < (long)(pbVar10 + (lVar9 - (long)__s) + -2)) {
    uVar3 = 0xfffffffe;
    goto LAB_001043c4;
  }
  memcpy(local_1c8,__s + lVar11,(size_t)(pbVar10 + (lVar9 - (long)__s) + -2));
  local_1c8[(long)(pbVar10 + ((lVar9 + -2) - (long)__s))] = '\0';
  if (local_204 == 1) {
    iVar2 = strcmp(local_88,local_1c8);
    local_204 = 1;
    if (iVar2 == 0) {
      local_88[0] = '\0';
      local_204 = 0;
      uVar3 = 0;
      if (!bVar1) goto LAB_001043c4;
    }
  }
  else {
    if (local_204 == 2) {
      iVar2 = strcmp(local_128,local_1c8);
      if (iVar2 != 0) goto LAB_001042c5;
      local_128[0] = '\0';
      local_204 = 1;
    }
    else {
      if ((local_204 != 3) || (iVar2 = strcmp(local_178,local_1c8), iVar2 != 0)) goto LAB_001042c5;
      local_178[0] = '\0';
      local_204 = 2;
    }
    if (!bVar1) {
      uVar3 = 0;
      goto LAB_001043c4;
    }
  }
LAB_001042c5:
  if ((!bVar1) && (uVar3 = appenddata(outbuf,outlen,&local_1e8,(char *)__s,local_1fc), uVar3 != 0))
  {
LAB_001043c4:
    if (__s != (byte *)0x0) {
      (*Curl_cfree)(__s);
    }
    uVar4 = 0;
    if (1 < uVar3) {
      if (*outbuf != (char *)0x0) {
        (*Curl_cfree)(*outbuf);
      }
      *outbuf = (char *)0x0;
      *outlen = 0;
      uVar4 = uVar3;
    }
    return uVar4;
  }
  goto LAB_00103ed3;
  while( true ) {
    bVar12 = pbVar10[1];
    pbVar10 = pbVar10 + 1;
    if (bVar12 == 0) break;
LAB_00104198:
    if ((bVar12 == 0x3e) || (((*ppuVar8)[bVar12] & 0x2000) != 0)) break;
  }
LAB_001041ba:
  uVar3 = 0xfffffffe;
  if (0x4f < (long)(pbVar10 + (lVar9 - (long)__s) + -1)) goto LAB_001043c4;
  memcpy(local_1c8,__s + lVar11 + -1,(size_t)(pbVar10 + (lVar9 - (long)__s) + -1));
  pbVar10[(long)(local_1c8 + ((lVar9 + -1) - (long)__s))] = 0;
  if ((local_1c8[0] == '!') || (local_1c8[0] == '?')) {
    bVar1 = true;
    goto LAB_00103ed3;
  }
  bVar12 = *pbVar10;
  if (bVar12 != 0) {
    ppuVar8 = __ctype_b_loc();
    do {
      if ((*(byte *)((long)*ppuVar8 + (ulong)bVar12 * 2 + 1) & 0x20) == 0) break;
      bVar12 = pbVar10[1];
      pbVar10 = pbVar10 + 1;
    } while (bVar12 != 0);
  }
  for (sVar6 = 0; (pbVar10[sVar6] != 0 && (pbVar10[sVar6] != 0x3e)); sVar6 = sVar6 + 1) {
  }
  if (0x4f < (long)sVar6) goto LAB_001043c4;
  memcpy(local_d8,pbVar10,sVar6);
  local_d8[sVar6] = '\0';
  if (local_204 == 2) {
    strcpy(local_178,local_1c8);
    iVar2 = strcmp(local_128,local_1d8);
    local_204 = 3;
    bVar1 = true;
    if ((iVar2 == 0) && (iVar2 = strcmp(local_178,local_1e0), iVar2 == 0)) {
      pcVar5 = strstr(local_d8,"base64=");
      if (pcVar5 != (char *)0x0) {
        local_1fc = 1;
      }
      local_204 = 3;
      bVar1 = false;
    }
    goto LAB_00103ed3;
  }
  if (local_204 == 1) {
    local_204 = 2;
    pcVar5 = local_128;
  }
  else {
    bVar14 = local_204 != 0;
    local_204 = 3;
    if (bVar14) goto LAB_001042c5;
    local_204 = 1;
    pcVar5 = local_88;
  }
  strcpy(pcVar5,local_1c8);
  bVar1 = true;
  goto LAB_00103ed3;
}

Assistant:

int getpart(char **outbuf, size_t *outlen,
            const char *main, const char *sub, FILE *stream)
{
# define MAX_TAG_LEN 79
  char couter[MAX_TAG_LEN+1]; /* current outermost section */
  char cmain[MAX_TAG_LEN+1];  /* current main section */
  char csub[MAX_TAG_LEN+1];   /* current sub section */
  char ptag[MAX_TAG_LEN+1];   /* potential tag */
  char patt[MAX_TAG_LEN+1];   /* potential attributes */
  char *buffer = NULL;
  char *ptr;
  char *end;
  union {
    ssize_t sig;
     size_t uns;
  } len;
  size_t bufsize = 0;
  size_t outalloc = 256;
  int in_wanted_part = 0;
  int base64 = 0;
  int error;

  enum {
    STATE_OUTSIDE = 0,
    STATE_OUTER   = 1,
    STATE_INMAIN  = 2,
    STATE_INSUB   = 3,
    STATE_ILLEGAL = 4
  } state = STATE_OUTSIDE;

  *outlen = 0;
  *outbuf = malloc(outalloc);
  if(!*outbuf)
    return GPE_OUT_OF_MEMORY;
  *(*outbuf) = '\0';

  couter[0] = cmain[0] = csub[0] = ptag[0] = patt[0] = '\0';

  while((error = readline(&buffer, &bufsize, stream)) == GPE_OK) {

    ptr = buffer;
    EAT_SPACE(ptr);

    if('<' != *ptr) {
      if(in_wanted_part) {
        show(("=> %s", buffer));
        error = appenddata(outbuf, outlen, &outalloc, buffer, base64);
        if(error)
          break;
      }
      continue;
    }

    ptr++;

    if('/' == *ptr) {
      /*
      ** closing section tag
      */

      ptr++;
      end = ptr;
      EAT_WORD(end);
      if((len.sig = end - ptr) > MAX_TAG_LEN) {
        error = GPE_NO_BUFFER_SPACE;
        break;
      }
      memcpy(ptag, ptr, len.uns);
      ptag[len.uns] = '\0';

      if((STATE_INSUB == state) && !strcmp(csub, ptag)) {
        /* end of current sub section */
        state = STATE_INMAIN;
        csub[0] = '\0';
        if(in_wanted_part) {
          /* end of wanted part */
          in_wanted_part = 0;
          break;
        }
      }
      else if((STATE_INMAIN == state) && !strcmp(cmain, ptag)) {
        /* end of current main section */
        state = STATE_OUTER;
        cmain[0] = '\0';
        if(in_wanted_part) {
          /* end of wanted part */
          in_wanted_part = 0;
          break;
        }
      }
      else if((STATE_OUTER == state) && !strcmp(couter, ptag)) {
        /* end of outermost file section */
        state = STATE_OUTSIDE;
        couter[0] = '\0';
        if(in_wanted_part) {
          /* end of wanted part */
          in_wanted_part = 0;
          break;
        }
      }

    }
    else if(!in_wanted_part) {
      /*
      ** opening section tag
      */

      /* get potential tag */
      end = ptr;
      EAT_WORD(end);
      if((len.sig = end - ptr) > MAX_TAG_LEN) {
        error = GPE_NO_BUFFER_SPACE;
        break;
      }
      memcpy(ptag, ptr, len.uns);
      ptag[len.uns] = '\0';

      /* ignore comments, doctypes and xml declarations */
      if(('!' == ptag[0]) || ('?' == ptag[0])) {
        show(("* ignoring (%s)", buffer));
        continue;
      }

      /* get all potential attributes */
      ptr = end;
      EAT_SPACE(ptr);
      end = ptr;
      while(*end && ('>' != *end))
        end++;
      if((len.sig = end - ptr) > MAX_TAG_LEN) {
        error = GPE_NO_BUFFER_SPACE;
        break;
      }
      memcpy(patt, ptr, len.uns);
      patt[len.uns] = '\0';

      if(STATE_OUTSIDE == state) {
        /* outermost element (<testcase>) */
        strcpy(couter, ptag);
        state = STATE_OUTER;
        continue;
      }
      else if(STATE_OUTER == state) {
        /* start of a main section */
        strcpy(cmain, ptag);
        state = STATE_INMAIN;
        continue;
      }
      else if(STATE_INMAIN == state) {
        /* start of a sub section */
        strcpy(csub, ptag);
        state = STATE_INSUB;
        if(!strcmp(cmain, main) && !strcmp(csub, sub)) {
          /* start of wanted part */
          in_wanted_part = 1;
          if(strstr(patt, "base64="))
              /* bit rough test, but "mostly" functional, */
              /* treat wanted part data as base64 encoded */
              base64 = 1;
        }
        continue;
      }

    }

    if(in_wanted_part) {
      show(("=> %s", buffer));
      error = appenddata(outbuf, outlen, &outalloc, buffer, base64);
      if(error)
        break;
    }

  } /* while */

  if(buffer)
    free(buffer);

  if(error != GPE_OK) {
    if(error == GPE_END_OF_FILE)
      error = GPE_OK;
    else {
      if(*outbuf)
        free(*outbuf);
      *outbuf = NULL;
      *outlen = 0;
    }
  }

  return error;
}